

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O3

uint8_t lys_stmt_flags(ly_stmt stmt)

{
  if ((int)stmt < 0x100000) {
    if ((int)stmt < 0x8000) {
      if ((int)stmt < 0x100) {
        if (((0x3f < stmt - LY_STMT_NOTIFICATION) ||
            ((0x8000000080008081U >> ((ulong)(stmt - LY_STMT_NOTIFICATION) & 0x3f) & 1) == 0)) &&
           (stmt != LY_STMT_AUGMENT)) {
          return '\0';
        }
      }
      else if ((int)stmt < 0x800) {
        if (((stmt != LY_STMT_CASE) && (stmt != LY_STMT_CHOICE)) && (stmt != LY_STMT_CONTAINER)) {
          return '\0';
        }
      }
      else if ((int)stmt < 0x2000) {
        if ((stmt != LY_STMT_GROUPING) && (stmt != LY_STMT_LEAF)) {
          return '\0';
        }
      }
      else if ((stmt != LY_STMT_LEAF_LIST) && (stmt != LY_STMT_LIST)) {
        return '\0';
      }
    }
    else if ((int)stmt < 0x60000) {
      if ((int)stmt < 0x30000) {
        if (((stmt != LY_STMT_USES) && (stmt != LY_STMT_ARGUMENT)) && (stmt != LY_STMT_BASE)) {
          return '\0';
        }
      }
      else if (((stmt != LY_STMT_BELONGS_TO) && (stmt != LY_STMT_BIT)) && (stmt != LY_STMT_CONFIG))
      {
        return '\0';
      }
    }
    else if ((int)stmt < 0xa0000) {
      if ((stmt == LY_STMT_CONTACT) || (stmt == LY_STMT_DESCRIPTION)) {
        return '\x01';
      }
      if (stmt != LY_STMT_DEVIATE) {
        return '\0';
      }
    }
    else if ((int)stmt < 0xd0000) {
      if ((stmt != LY_STMT_DEVIATION) && (stmt != LY_STMT_ENUM)) {
        return '\0';
      }
    }
    else {
      if (stmt == LY_STMT_ERROR_MESSAGE) {
        return '\x01';
      }
      if (stmt != LY_STMT_EXTENSION) {
        return '\0';
      }
    }
  }
  else if ((int)stmt < 0x240000) {
    if ((int)stmt < 0x190000) {
      if ((int)stmt < 0x140000) {
        if (((stmt != LY_STMT_FEATURE) && (stmt != LY_STMT_FRACTION_DIGITS)) &&
           (stmt != LY_STMT_IDENTITY)) {
          return '\0';
        }
      }
      else if (((stmt != LY_STMT_IMPORT) && (stmt != LY_STMT_INCLUDE)) &&
              (stmt != LY_STMT_MANDATORY)) {
        return '\0';
      }
    }
    else if ((int)stmt < 0x1c0000) {
      if (((stmt != LY_STMT_MAX_ELEMENTS) && (stmt != LY_STMT_MIN_ELEMENTS)) &&
         (stmt != LY_STMT_MODIFIER)) {
        return '\0';
      }
    }
    else if ((int)stmt < 0x200000) {
      if ((stmt != LY_STMT_MODULE) && (stmt != LY_STMT_ORDERED_BY)) {
        return '\0';
      }
    }
    else {
      if (stmt == LY_STMT_ORGANIZATION) {
        return '\x01';
      }
      if (stmt != LY_STMT_POSITION) {
        return '\0';
      }
    }
  }
  else if ((int)stmt < 0x2c0000) {
    if ((int)stmt < 0x290000) {
      if (stmt != LY_STMT_PREFIX) {
        if (stmt == LY_STMT_REFERENCE) {
          return '\x01';
        }
        if (stmt != LY_STMT_REFINE) {
          return '\0';
        }
      }
    }
    else if (((stmt != LY_STMT_REQUIRE_INSTANCE) && (stmt != LY_STMT_REVISION)) &&
            (stmt != LY_STMT_REVISION_DATE)) {
      return '\0';
    }
  }
  else if ((int)stmt < 0x2f0000) {
    if (((stmt != LY_STMT_STATUS) && (stmt != LY_STMT_SUBMODULE)) && (stmt != LY_STMT_TYPE)) {
      return '\0';
    }
  }
  else if ((int)stmt < 0x340000) {
    if ((stmt != LY_STMT_TYPEDEF) && (stmt != LY_STMT_VALUE)) {
      return '\0';
    }
  }
  else if ((stmt != LY_STMT_YIN_ELEMENT) && (stmt != LY_STMT_YANG_VERSION)) {
    return '\0';
  }
  return '\x02';
}

Assistant:

uint8_t
lys_stmt_flags(enum ly_stmt stmt)
{
    switch (stmt) {
    case LY_STMT_NONE:
    case LY_STMT_ARG_TEXT:
    case LY_STMT_ARG_VALUE:
    case LY_STMT_DEFAULT:
    case LY_STMT_ERROR_APP_TAG:
    case LY_STMT_EXTENSION_INSTANCE:
    case LY_STMT_IF_FEATURE:
    case LY_STMT_INPUT:
    case LY_STMT_KEY:
    case LY_STMT_LENGTH:
    case LY_STMT_MUST:
    case LY_STMT_NAMESPACE:
    case LY_STMT_OUTPUT:
    case LY_STMT_PATH:
    case LY_STMT_PATTERN:
    case LY_STMT_PRESENCE:
    case LY_STMT_RANGE:
    case LY_STMT_SYNTAX_LEFT_BRACE:
    case LY_STMT_SYNTAX_RIGHT_BRACE:
    case LY_STMT_SYNTAX_SEMICOLON:
    case LY_STMT_UNIQUE:
    case LY_STMT_UNITS:
    case LY_STMT_WHEN:
        return 0;
    case LY_STMT_ACTION:
    case LY_STMT_ANYDATA:
    case LY_STMT_ANYXML:
    case LY_STMT_ARGUMENT:
    case LY_STMT_AUGMENT:
    case LY_STMT_BASE:
    case LY_STMT_BELONGS_TO:
    case LY_STMT_BIT:
    case LY_STMT_CASE:
    case LY_STMT_CHOICE:
    case LY_STMT_CONFIG:
    case LY_STMT_CONTAINER:
    case LY_STMT_DEVIATE:
    case LY_STMT_DEVIATION:
    case LY_STMT_ENUM:
    case LY_STMT_EXTENSION:
    case LY_STMT_FEATURE:
    case LY_STMT_FRACTION_DIGITS:
    case LY_STMT_GROUPING:
    case LY_STMT_IDENTITY:
    case LY_STMT_IMPORT:
    case LY_STMT_INCLUDE:
    case LY_STMT_LEAF:
    case LY_STMT_LEAF_LIST:
    case LY_STMT_LIST:
    case LY_STMT_MANDATORY:
    case LY_STMT_MAX_ELEMENTS:
    case LY_STMT_MIN_ELEMENTS:
    case LY_STMT_MODIFIER:
    case LY_STMT_MODULE:
    case LY_STMT_NOTIFICATION:
    case LY_STMT_ORDERED_BY:
    case LY_STMT_POSITION:
    case LY_STMT_PREFIX:
    case LY_STMT_REFINE:
    case LY_STMT_REQUIRE_INSTANCE:
    case LY_STMT_REVISION:
    case LY_STMT_REVISION_DATE:
    case LY_STMT_RPC:
    case LY_STMT_STATUS:
    case LY_STMT_SUBMODULE:
    case LY_STMT_TYPE:
    case LY_STMT_TYPEDEF:
    case LY_STMT_USES:
    case LY_STMT_VALUE:
    case LY_STMT_YANG_VERSION:
    case LY_STMT_YIN_ELEMENT:
        return LY_STMT_FLAG_ID;
    case LY_STMT_CONTACT:
    case LY_STMT_DESCRIPTION:
    case LY_STMT_ERROR_MESSAGE:
    case LY_STMT_ORGANIZATION:
    case LY_STMT_REFERENCE:
        return LY_STMT_FLAG_YIN;
    }

    return 0;
}